

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Employee.cpp
# Opt level: O2

istream * operator>>(istream *i,Employee *e)

{
  ostream *poVar1;
  int workDone1;
  int workToDo1;
  int salaryPerHour1;
  int hourWork1;
  string id1;
  string name1;
  Address a;
  Person p;
  allocator local_1ab;
  allocator local_1aa;
  allocator local_1a9;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  Address local_118;
  Person local_b8;
  
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_b8,"",&local_1aa);
  std::__cxx11::string::string((string *)&local_178,"",&local_1ab);
  std::__cxx11::string::string((string *)&local_198,"",&local_1a9);
  Address::Address(&local_118,(string *)&local_b8,&local_178,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string((string *)&local_178,"",&local_1aa);
  std::__cxx11::string::string((string *)&local_198,"92*sa11178",&local_1ab);
  Person::Person(&local_b8,&local_178,&local_198,&local_118);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_178);
  std::operator<<((ostream *)&std::cout,"Enter name: ");
  std::operator>>(i,(string *)&local_138);
  std::operator<<((ostream *)&std::cout,"Enter id: ");
  std::operator>>(i,(string *)&local_158);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter address: ");
  std::endl<char,std::char_traits<char>>(poVar1);
  operator>>(i,&local_118);
  Person::setName(&local_b8,&local_138);
  Person::setId(&local_b8,&local_158);
  Person::setAddress(&local_b8,&local_118);
  std::operator<<((ostream *)&std::cout,"Enter hour work: ");
  std::istream::operator>>((istream *)i,&local_19c);
  std::operator<<((ostream *)&std::cout,"Enter salary per hour: ");
  std::istream::operator>>((istream *)i,&local_1a0);
  std::operator<<((ostream *)&std::cout,"Enter work to do: ");
  std::istream::operator>>((istream *)i,&local_1a4);
  std::operator<<((ostream *)&std::cout,"Enter work done: ");
  std::istream::operator>>((istream *)i,&local_1a8);
  e->salaryPerHour = local_1a0;
  e->hourWork = local_19c;
  e->workDone = local_1a8;
  e->workToDo = local_1a4;
  Person::~Person(&local_b8);
  Address::~Address(&local_118);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  return i;
}

Assistant:

std::istream &operator>>(istream &i, Employee &e) {

    int hourWork1, salaryPerHour1, workToDo1, workDone1;
    string name1, id1;
    Address a("", "", "");
    Person p("", "92*sa11178", a);
    cout << "Enter name: ";
    i >> name1;
    cout << "Enter id: ";
    i >> id1;
    cout << "Enter address: " << endl;
    i >> a;
    p.setName(name1);
    p.setId(id1);
    p.setAddress(a);
    cout << "Enter hour work: ";
    i >> hourWork1;
    cout << "Enter salary per hour: ";
    i >> salaryPerHour1;
    cout << "Enter work to do: ";
    i >> workToDo1;
    cout << "Enter work done: ";
    i >> workDone1;
    e.setSalaryPerHour(salaryPerHour1);
    e.setHourWork(hourWork1);
    e.setWorkDone(workDone1);
    e.setWorkToDo(workToDo1);
    return i;
}